

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_GetBlindingKey_Test::TestBody
          (ElementsConfidentialAddress_GetBlindingKey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_710;
  Message local_708;
  string local_700;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_2;
  Message local_6c8;
  ElementsConfidentialAddress local_6c0;
  undefined1 local_508 [8];
  ElementsConfidentialAddress confidential_address;
  Message local_348;
  string local_340;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_1;
  Pubkey confidential_key;
  Message local_2f0;
  string local_2e8;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar;
  Message local_2b0 [2];
  Script local_2a0;
  Privkey local_268;
  undefined1 local_248 [8];
  Privkey blinding_key;
  allocator local_209;
  string local_208;
  undefined1 local_1e8 [8];
  Address unblind_addr;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey master_blinding_key;
  ElementsConfidentialAddress_GetBlindingKey_Test *this_local;
  
  master_blinding_key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"881a1ab07e99ab0626b4d93b3dddfd16cbc04342ee71aab4da7093e7b853fd80",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"ert1q0zln07l8vgm5qf4jhzz00668lfs7xssdlxlysh",&local_209);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            ((Address *)local_1e8,&local_208,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &blinding_key.is_compressed_);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &blinding_key.is_compressed_);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  cfd::core::Privkey::Privkey((Privkey *)local_248);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::GetLockingScript(&local_2a0,(Address *)local_1e8);
      cfd::core::ElementsConfidentialAddress::GetBlindingKey
                (&local_268,(Privkey *)local_30,&local_2a0);
      cfd::core::Privkey::operator=((Privkey *)local_248,&local_268);
      cfd::core::Privkey::~Privkey(&local_268);
      cfd::core::Script::~Script(&local_2a0);
    }
  }
  else {
    testing::Message::Message(local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x227,
               "Expected: (blinding_key = ElementsConfidentialAddress::GetBlindingKey( master_blinding_key, unblind_addr.GetLockingScript())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_2b0);
  }
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_2e8,(Privkey *)local_248);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2c8,
             "\"95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742\"",
             "blinding_key.GetHex().c_str()",
             "95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742",pcVar2);
  std::__cxx11::string::~string((string *)&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &confidential_key.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x229,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &confidential_key.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &confidential_key.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)&gtest_ar_1.message_,(Privkey *)local_248,true);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_340,(Pubkey *)&gtest_ar_1.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_320,
             "\"0273f33808de34256679f932410fca27721ce3b287083c903d6c10dfabb600336e\"",
             "confidential_key.GetHex().c_str()",
             "0273f33808de34256679f932410fca27721ce3b287083c903d6c10dfabb600336e",pcVar2);
  std::__cxx11::string::~string((string *)&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&confidential_address.address_.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x22d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&confidential_address.address_.field_2 + 8),&local_348);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&confidential_address.address_.field_2 + 8));
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_508);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                (&local_6c0,(Address *)local_1e8,(ConfidentialKey *)&gtest_ar_1.message_);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)local_508,&local_6c0);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_6c0);
    }
  }
  else {
    testing::Message::Message(&local_6c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x231,
               "Expected: (confidential_address = ElementsConfidentialAddress(unblind_addr, confidential_key)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_6c8);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_700,(ElementsConfidentialAddress *)local_508);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6e0,
             "\"el1qqfelxwqgmc6z2enelyeyzr72yaepecajsuyreypadsgdl2akqqeku79lxla7wc3hgqnt9wyy7l4507npudpq6typz2y9he7wu\""
             ,"confidential_address.GetAddress().c_str()",
             "el1qqfelxwqgmc6z2enelyeyzr72yaepecajsuyreypadsgdl2akqqeku79lxla7wc3hgqnt9wyy7l4507npudpq6typz2y9he7wu"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x234,pcVar2);
    testing::internal::AssertHelper::operator=(&local_710,&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_710);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_508);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar_1.message_);
  cfd::core::Privkey::~Privkey((Privkey *)local_248);
  cfd::core::Address::~Address((Address *)local_1e8);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, GetBlindingKey) {
  const Privkey master_blinding_key(
      "881a1ab07e99ab0626b4d93b3dddfd16cbc04342ee71aab4da7093e7b853fd80");
  Address unblind_addr("ert1q0zln07l8vgm5qf4jhzz00668lfs7xssdlxlysh",
      GetElementsAddressFormatList());

  Privkey blinding_key;
  EXPECT_NO_THROW(
      (blinding_key =
          ElementsConfidentialAddress::GetBlindingKey(
                  master_blinding_key,
                  unblind_addr.GetLockingScript())));
  EXPECT_STREQ("95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742",
               blinding_key.GetHex().c_str());
  Pubkey confidential_key = blinding_key.GeneratePubkey();
  EXPECT_STREQ(
      "0273f33808de34256679f932410fca27721ce3b287083c903d6c10dfabb600336e",
      confidential_key.GetHex().c_str());
  ElementsConfidentialAddress confidential_address;
  EXPECT_NO_THROW(
      (confidential_address =
          ElementsConfidentialAddress(unblind_addr, confidential_key)));
  EXPECT_STREQ(
      "el1qqfelxwqgmc6z2enelyeyzr72yaepecajsuyreypadsgdl2akqqeku79lxla7wc3hgqnt9wyy7l4507npudpq6typz2y9he7wu",
      confidential_address.GetAddress().c_str());
}